

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_proto2_unittest::TestAllTypes>::iterator,_bool>
* __thiscall
google::protobuf::Map<std::__cxx11::string,proto2_unittest::TestAllTypes>::
TryEmplaceInternal<std::__cxx11::string&>
          (pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_proto2_unittest::TestAllTypes>::iterator,_bool>
           *__return_storage_ptr__,Map<std::__cxx11::string,proto2_unittest::TestAllTypes> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k)

{
  BaseIt it;
  BaseIt it_00;
  undefined8 args;
  bool bVar1;
  NodeBase *node_00;
  NodeAndBucket NVar2;
  bool local_d9;
  NodeBase *local_d8;
  Map<std::__cxx11::string,proto2_unittest::TestAllTypes> *local_d0;
  map_index_t local_c8;
  undefined4 uStack_c4;
  iterator local_c0;
  NodeBase *local_a8;
  Node *node;
  bool local_89;
  NodeBase *local_88;
  Map<std::__cxx11::string,proto2_unittest::TestAllTypes> *local_80;
  map_index_t local_78;
  undefined4 uStack_74;
  iterator local_70;
  map_index_t local_54;
  undefined1 auStack_50 [4];
  map_index_t b;
  NodeBase *local_40;
  NodeAndBucket p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k_local;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_proto2_unittest::TestAllTypes>
  *this_local;
  Node *node_1;
  
  p._8_8_ = k;
  _auStack_50 = internal::TransparentSupport<std::__cxx11::string>::ToView<std::__cxx11::string>(k);
  NVar2 = internal::
          KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::FindHelper((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)this,_auStack_50);
  local_88 = NVar2.node;
  local_78 = NVar2.bucket;
  local_54 = local_78;
  local_40 = local_88;
  p.node._0_4_ = local_78;
  if (local_88 == (NodeBase *)0x0) {
    bVar1 = internal::
            KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::ResizeIfLoadIsOutOfRange
                      ((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)this,(ulong)(*(int *)this + 1));
    if (bVar1) {
      _node = internal::TransparentSupport<std::__cxx11::string>::ToView<std::__cxx11::string>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         p._8_8_);
      local_54 = internal::
                 KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::BucketNumber((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)this,_node);
    }
    args = p._8_8_;
    node_00 = internal::UntypedMapBase::AllocNode((UntypedMapBase *)this,0x368);
    bVar1 = internal::InitializeMapKey<std::__cxx11::string,std::__cxx11::string&>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (node_00 + 1),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args,
                       *(Arena **)(this + 0x18));
    if (!bVar1) {
      Arena::CreateInArenaStorage<std::__cxx11::string,std::__cxx11::string&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(node_00 + 1),
                 *(Arena **)(this + 0x18),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
    }
    Arena::CreateInArenaStorage<proto2_unittest::TestAllTypes>
              ((TestAllTypes *)(node_00 + 5),*(Arena **)(this + 0x18));
    local_a8 = node_00;
    internal::
    KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    InsertUnique((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)this,local_54,(KeyNode *)node_00);
    *(int *)this = *(int *)this + 1;
    local_d8 = local_a8;
    local_c8 = local_54;
    it_00._20_4_ = uStack_c4;
    it_00.bucket_index_ = local_54;
    it_00.m_ = (UntypedMapBase *)this;
    it_00.node_ = local_a8;
    local_d0 = this;
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_proto2_unittest::TestAllTypes>
    ::iterator::iterator(&local_c0,it_00);
    local_d9 = true;
    std::
    make_pair<google::protobuf::Map<std::__cxx11::string,proto2_unittest::TestAllTypes>::iterator,bool>
              (__return_storage_ptr__,&local_c0,&local_d9);
  }
  else {
    it._20_4_ = uStack_74;
    it.bucket_index_ = local_78;
    it.m_ = (UntypedMapBase *)this;
    it.node_ = local_88;
    local_80 = this;
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_proto2_unittest::TestAllTypes>
    ::iterator::iterator(&local_70,it);
    local_89 = false;
    std::
    make_pair<google::protobuf::Map<std::__cxx11::string,proto2_unittest::TestAllTypes>::iterator,bool>
              (__return_storage_ptr__,&local_70,&local_89);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> TryEmplaceInternal(K&& k, Args&&... args) {
    auto p = this->FindHelper(TS::ToView(k));
    internal::map_index_t b = p.bucket;
    // Case 1: key was already present.
    if (p.node != nullptr) {
      return std::make_pair(iterator(internal::UntypedMapIterator{
                                static_cast<Node*>(p.node), this, p.bucket}),
                            false);
    }
    // Case 2: insert.
    if (this->ResizeIfLoadIsOutOfRange(this->num_elements_ + 1)) {
      b = this->BucketNumber(TS::ToView(k));
    }
    auto* node = CreateNode(std::forward<K>(k), std::forward<Args>(args)...);
    this->InsertUnique(b, node);
    ++this->num_elements_;
    return std::make_pair(iterator(internal::UntypedMapIterator{node, this, b}),
                          true);
  }